

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::DebugStringFieldValuePrinter::PrintMessageStart
          (DebugStringFieldValuePrinter *this,Message *param_1,int param_2,int param_3,
          bool single_line_mode,BaseTextGenerator *generator)

{
  char *str;
  undefined7 in_register_00000081;
  StringPiece *this_00;
  StringPiece *this_01;
  StringPiece SStack_58;
  StringPiece local_48;
  StringPiece local_38;
  StringPiece local_28;
  
  this_01 = &SStack_58;
  if ((int)CONCAT71(in_register_00000081,single_line_mode) == 0) {
    this_00 = &local_48;
    stringpiece_internal::StringPiece::StringPiece(this_00," ");
    str = "{\n";
  }
  else {
    this_00 = &local_28;
    stringpiece_internal::StringPiece::StringPiece(this_00," ");
    str = "{ ";
    this_01 = &local_38;
  }
  stringpiece_internal::StringPiece::StringPiece(this_01,str);
  TextGenerator::PrintMaybeWithMarker((TextGenerator *)generator,*this_00,*this_01);
  return;
}

Assistant:

void PrintMessageStart(const Message& /*message*/, int /*field_index*/,
                         int /*field_count*/, bool single_line_mode,
                         BaseTextGenerator* generator) const override {
    // This is safe as only TextGenerator is used with
    // DebugStringFieldValuePrinter.
    TextGenerator* text_generator = static_cast<TextGenerator*>(generator);
    if (single_line_mode) {
      text_generator->PrintMaybeWithMarker(" ", "{ ");
    } else {
      text_generator->PrintMaybeWithMarker(" ", "{\n");
    }
  }